

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readpsm.c
# Opt level: O3

void dumb_it_optimize_orders(DUMB_IT_SIGDATA *sigdata)

{
  ulong uVar1;
  IT_PATTERN *pIVar2;
  byte bVar3;
  byte bVar4;
  IT_PATTERN *pIVar5;
  int iVar6;
  int iVar7;
  void *__base;
  IT_PATTERN *pIVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  IT_PATTERN *pIVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  IT_ENTRY *pIVar18;
  IT_ENTRY *pIVar19;
  uchar *puVar20;
  size_t __size;
  
  iVar6 = sigdata->n_orders;
  __size = (size_t)iVar6;
  if (((__size == 0) || (iVar7 = sigdata->n_patterns, iVar7 == 0)) ||
     (__base = malloc(__size), __base == (void *)0x0)) {
    return;
  }
  if (iVar6 < 1) goto LAB_0070d765;
  puVar20 = sigdata->order;
  sVar9 = 0;
  uVar14 = 0;
  do {
    bVar3 = puVar20[sVar9];
    if ((int)(uint)bVar3 < iVar7) {
      if ((int)uVar14 < 1) {
        uVar15 = 0;
LAB_0070d452:
        if ((uint)uVar15 != uVar14) goto LAB_0070d45f;
      }
      else {
        uVar15 = 0;
        do {
          if (bVar3 == *(byte *)((long)__base + uVar15)) goto LAB_0070d452;
          uVar15 = uVar15 + 1;
        } while (uVar14 != uVar15);
      }
      lVar16 = (long)(int)uVar14;
      uVar14 = uVar14 + 1;
      *(byte *)((long)__base + lVar16) = bVar3;
    }
LAB_0070d45f:
    sVar9 = sVar9 + 1;
  } while (sVar9 != __size);
  if (uVar14 == 0) goto LAB_0070d765;
  if ((int)uVar14 < 1) {
    qsort(__base,(long)(int)uVar14,1,it_order_compare);
LAB_0070d664:
    iVar6 = 0;
  }
  else {
    uVar11 = (ulong)uVar14;
    lVar16 = 2;
    uVar10 = 1;
    uVar15 = 0;
    do {
      uVar1 = uVar15 + 1;
      if (uVar1 < uVar11) {
        bVar3 = *(byte *)((long)__base + uVar15);
        uVar15 = uVar10;
        lVar17 = lVar16;
        do {
          bVar4 = *(byte *)((long)__base + uVar15);
          if (bVar3 != bVar4) {
            pIVar8 = sigdata->pattern;
            iVar6 = pIVar8[bVar3].n_entries;
            if (iVar6 == pIVar8[bVar4].n_entries) {
              if (0 < iVar6) {
                pIVar18 = pIVar8[bVar3].entry;
                pIVar19 = pIVar18 + iVar6;
                puVar20 = &(pIVar8[bVar4].entry)->effectvalue;
                do {
                  if (((pIVar18->channel < 0x40) || (((IT_ENTRY *)(puVar20 + -6))->channel < 0x40))
                     && (((((pIVar18->channel != ((IT_ENTRY *)(puVar20 + -6))->channel ||
                            (bVar4 = pIVar18->mask, bVar4 != puVar20[-5])) ||
                           (((bVar4 & 1) != 0 && (pIVar18->note != puVar20[-4])))) ||
                          (((bVar4 & 2) != 0 && (pIVar18->instrument != puVar20[-3])))) ||
                         ((((bVar4 & 4) != 0 && (pIVar18->volpan != puVar20[-2])) ||
                          (((bVar4 & 8) != 0 &&
                           ((pIVar18->effect != puVar20[-1] || (pIVar18->effectvalue != *puVar20))))
                          )))))) goto LAB_0070d5d0;
                  pIVar18 = pIVar18 + 1;
                  puVar20 = puVar20 + 7;
                } while (pIVar18 < pIVar19);
              }
              if (0 < (int)__size) {
                lVar12 = 0;
                do {
                  if (sigdata->order[lVar12] == *(uchar *)((long)__base + uVar15)) {
                    sigdata->order[lVar12] = bVar3;
                    __size = (size_t)(uint)sigdata->n_orders;
                  }
                  lVar12 = lVar12 + 1;
                } while (lVar12 < (int)__size);
              }
              iVar6 = (int)uVar15 + 1;
              lVar12 = lVar17;
              while (iVar6 < (int)uVar14) {
                if (*(char *)((long)__base + lVar12) == *(char *)((long)__base + uVar15)) {
                  *(byte *)((long)__base + lVar12) = bVar3;
                }
                lVar12 = lVar12 + 1;
                iVar6 = (int)lVar12;
              }
              *(byte *)((long)__base + uVar15) = bVar3;
            }
          }
LAB_0070d5d0:
          uVar15 = uVar15 + 1;
          lVar17 = lVar17 + 1;
        } while (uVar15 != uVar11);
      }
      lVar16 = lVar16 + 1;
      uVar10 = uVar10 + 1;
      uVar15 = uVar1;
    } while (uVar1 != uVar11);
    qsort(__base,uVar11,1,it_order_compare);
    if ((int)uVar14 < 1) goto LAB_0070d664;
    uVar15 = 0;
    iVar6 = 0;
    do {
      if (*(char *)((long)__base + uVar15) != *(char *)((long)__base + (long)iVar6)) {
        lVar16 = (long)iVar6 + 1;
        if (lVar16 < (long)uVar15) {
          *(char *)((long)__base + lVar16) = *(char *)((long)__base + uVar15);
        }
        iVar6 = (int)lVar16;
      }
      uVar15 = uVar15 + 1;
    } while (uVar11 != uVar15);
  }
  uVar14 = iVar6 + 1;
  pIVar8 = (IT_PATTERN *)malloc((long)(int)uVar14 << 4);
  if (pIVar8 != (IT_PATTERN *)0x0) {
    uVar15 = (ulong)uVar14;
    if (-1 < iVar6) {
      pIVar5 = sigdata->pattern;
      uVar10 = 0;
      pIVar13 = pIVar8;
      do {
        pIVar2 = pIVar5 + *(byte *)((long)__base + uVar10);
        iVar7 = pIVar2->n_entries;
        pIVar18 = pIVar2->entry;
        pIVar13->n_rows = pIVar2->n_rows;
        pIVar13->n_entries = iVar7;
        pIVar13->entry = pIVar18;
        uVar10 = uVar10 + 1;
        pIVar13 = pIVar13 + 1;
      } while (uVar15 != uVar10);
    }
    iVar7 = sigdata->n_patterns;
    if (0 < iVar7) {
      uVar10 = 0;
      do {
        uVar11 = 0;
        if (iVar6 < 0) {
LAB_0070d6de:
          if ((uint)uVar11 == uVar14) goto LAB_0070d6e2;
        }
        else {
          uVar11 = 0;
          do {
            if (uVar10 == *(byte *)((long)__base + uVar11)) goto LAB_0070d6de;
            uVar11 = uVar11 + 1;
          } while (uVar15 != uVar11);
LAB_0070d6e2:
          pIVar18 = sigdata->pattern[uVar10].entry;
          if (pIVar18 != (IT_ENTRY *)0x0) {
            free(pIVar18);
            iVar7 = sigdata->n_patterns;
          }
        }
        uVar10 = uVar10 + 1;
      } while ((long)uVar10 < (long)iVar7);
    }
    free(sigdata->pattern);
    sigdata->pattern = pIVar8;
    sigdata->n_patterns = uVar14;
    iVar7 = sigdata->n_orders;
    if (0 < iVar7) {
      lVar16 = 0;
      do {
        if (-1 < iVar6) {
          uVar10 = 0;
          do {
            if (sigdata->order[lVar16] == *(uchar *)((long)__base + uVar10)) {
              sigdata->order[lVar16] = (uchar)uVar10;
              iVar7 = sigdata->n_orders;
              break;
            }
            uVar10 = uVar10 + 1;
          } while (uVar15 != uVar10);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < iVar7);
    }
  }
LAB_0070d765:
  free(__base);
  return;
}

Assistant:

static void dumb_it_optimize_orders(DUMB_IT_SIGDATA * sigdata) {
	int n, o, p;

    /*int last_invalid = (sigdata->flags & IT_WAS_AN_XM) ? 255 : 253;*/

	unsigned char * order_list;
	int n_patterns;

	IT_PATTERN * pattern;

	if (!sigdata->n_orders || !sigdata->n_patterns) return;

	n_patterns = 0;
	order_list = malloc(sigdata->n_orders);

	if (!order_list) return;

	for (n = 0; n < sigdata->n_orders; n++) {
		if (sigdata->order[n] < sigdata->n_patterns) {
			for (o = 0; o < n_patterns; o++) {
				if (sigdata->order[n] == order_list[o]) break;
			}
			if (o == n_patterns) {
				order_list[n_patterns++] = sigdata->order[n];
			}
		}
	}

	if (!n_patterns) {
		free(order_list);
		return;
	}

	/*for (n = 0; n < n_patterns; n++) {
		dumb_it_optimize_pattern(&sigdata->pattern[order_list[n]]);
	}*/

	for (n = 0; n < n_patterns; n++) {
		for (o = n + 1; o < n_patterns; o++) {
			if ((order_list[n] != order_list[o]) &&
				it_pattern_compare(&sigdata->pattern[order_list[n]], &sigdata->pattern[order_list[o]])) {
				for (p = 0; p < sigdata->n_orders; p++) {
					if (sigdata->order[p] == order_list[o]) {
						sigdata->order[p] = order_list[n];
					}
				}
				for (p = o + 1; p < n_patterns; p++) {
					if (order_list[p] == order_list[o]) {
						order_list[p] = order_list[n];
					}
				}
				order_list[o] = order_list[n];
			}
		}
	}

	qsort(order_list, n_patterns, sizeof(*order_list), &it_order_compare);

	for (n = 0, o = 0; n < n_patterns; n++) {
		if (order_list[n] != order_list[o]) {
			if (++o < n) order_list[o] = order_list[n];
		}
	}

	n_patterns = o + 1;

	pattern = malloc(n_patterns * sizeof(*pattern));
	if (!pattern) {
		free(order_list);
		return;
	}

	for (n = 0; n < n_patterns; n++) {
		pattern[n] = sigdata->pattern[order_list[n]];
	}

	for (n = 0; n < sigdata->n_patterns; n++) {
		for (o = 0; o < n_patterns; o++) {
			if (order_list[o] == n) break;
		}
		if (o == n_patterns) {
			if (sigdata->pattern[n].entry)
				free(sigdata->pattern[n].entry);
		}
	}

	free(sigdata->pattern);
	sigdata->pattern = pattern;
	sigdata->n_patterns = n_patterns;

	for (n = 0; n < sigdata->n_orders; n++) {
		for (o = 0; o < n_patterns; o++) {
			if (sigdata->order[n] == order_list[o]) {
				sigdata->order[n] = o;
				break;
			}
		}
	}

	free(order_list);
}